

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableSetColumnSortDirection
               (int column_n,ImGuiSortDirection sort_direction,bool append_to_sort_specs)

{
  ImGuiTable *table;
  ImGuiTableColumn *pIVar1;
  ImGuiTableColumn *column;
  ImGuiTableColumnIdx IVar2;
  int other_column_n;
  uint i;
  int i_00;
  byte bVar3;
  char cVar4;
  
  table = GImGui->CurrentTable;
  if ((table->Flags & 0x8000000U) == 0 && sort_direction == 0) {
    __assert_fail("sort_direction != ImGuiSortDirection_None",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_tables.cpp"
                  ,0xa16,"void ImGui::TableSetColumnSortDirection(int, ImGuiSortDirection, bool)");
  }
  bVar3 = (byte)((uint)table->Flags >> 0x1a) & append_to_sort_specs;
  i = 0;
  if (bVar3 != 0) {
    cVar4 = '\0';
    for (; (int)i < table->ColumnsCount; i = i + 1) {
      pIVar1 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,i);
      if (cVar4 <= pIVar1->SortOrder) {
        cVar4 = pIVar1->SortOrder;
      }
    }
    i = (uint)(byte)(cVar4 + 1);
  }
  IVar2 = (ImGuiTableColumnIdx)i;
  pIVar1 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,column_n);
  pIVar1->field_0x64 = pIVar1->field_0x64 & 0xfc | (byte)sort_direction & 3;
  if ((sort_direction & 3U) == 0) {
    IVar2 = -1;
  }
  else if ((bVar3 & pIVar1->SortOrder != -1) != 0) goto LAB_0018a4e5;
  pIVar1->SortOrder = IVar2;
LAB_0018a4e5:
  for (i_00 = 0; i_00 < table->ColumnsCount; i_00 = i_00 + 1) {
    column = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,i_00);
    if (column != pIVar1 && bVar3 == 0) {
      column->SortOrder = -1;
    }
    TableFixColumnSortDirection(table,column);
  }
  table->IsSettingsDirty = true;
  table->IsSortSpecsDirty = true;
  return;
}

Assistant:

void ImGui::TableSetColumnSortDirection(int column_n, ImGuiSortDirection sort_direction, bool append_to_sort_specs)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;

    if (!(table->Flags & ImGuiTableFlags_SortMulti))
        append_to_sort_specs = false;
    if (!(table->Flags & ImGuiTableFlags_SortTristate))
        IM_ASSERT(sort_direction != ImGuiSortDirection_None);

    ImGuiTableColumnIdx sort_order_max = 0;
    if (append_to_sort_specs)
        for (int other_column_n = 0; other_column_n < table->ColumnsCount; other_column_n++)
            sort_order_max = ImMax(sort_order_max, table->Columns[other_column_n].SortOrder);

    ImGuiTableColumn* column = &table->Columns[column_n];
    column->SortDirection = (ImU8)sort_direction;
    if (column->SortDirection == ImGuiSortDirection_None)
        column->SortOrder = -1;
    else if (column->SortOrder == -1 || !append_to_sort_specs)
        column->SortOrder = append_to_sort_specs ? sort_order_max + 1 : 0;

    for (int other_column_n = 0; other_column_n < table->ColumnsCount; other_column_n++)
    {
        ImGuiTableColumn* other_column = &table->Columns[other_column_n];
        if (other_column != column && !append_to_sort_specs)
            other_column->SortOrder = -1;
        TableFixColumnSortDirection(table, other_column);
    }
    table->IsSettingsDirty = true;
    table->IsSortSpecsDirty = true;
}